

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O3

uint8_t * __thiscall
arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(Builder *this,Value *sub)

{
  uint8_t *puVar1;
  
  if ((this->_stack).
      super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->_stack).
      super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (this->_keyWritten == false) {
      reportAdd(this);
    }
    puVar1 = set(this,sub);
    return puVar1;
  }
  puVar1 = set(this,sub);
  return puVar1;
}

Assistant:

uint8_t* addInternal(T const& sub) {
    if (_stack.empty() || std::is_same<T, Serializable>::value) {
      return set(sub);
    }

    if (!_keyWritten) {
      reportAdd();
    }
    try {
      return set(sub);
    } catch (...) {
      // clean up in case of an exception
      cleanupAdd();
      throw;
    }
  }